

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_18c56::OpenGLGraphicsPlugin::~OpenGLGraphicsPlugin(OpenGLGraphicsPlugin *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_int,_unsigned_int> *colorToDepth;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  OpenGLGraphicsPlugin *this_local;
  
  (this->super_IGraphicsPlugin)._vptr_IGraphicsPlugin =
       (_func_int **)&PTR__OpenGLGraphicsPlugin_00159820;
  if (this->m_swapchainFramebuffer != 0) {
    (*glDeleteFramebuffers)(1,&this->m_swapchainFramebuffer);
  }
  if (this->m_program != 0) {
    (*glDeleteProgram)(this->m_program);
  }
  if (this->m_vao != 0) {
    (*glDeleteVertexArrays)(1,&this->m_vao);
  }
  if (this->m_cubeVertexBuffer != 0) {
    (*glDeleteBuffers)(1,&this->m_cubeVertexBuffer);
  }
  if (this->m_cubeIndexBuffer != 0) {
    (*glDeleteBuffers)(1,&this->m_cubeIndexBuffer);
  }
  __end2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin(&this->m_colorToDepthMap);
  colorToDepth = (pair<const_unsigned_int,_unsigned_int> *)
                 std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::end(&this->m_colorToDepthMap);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&colorToDepth);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                       (&__end2);
    if (ppVar2->second != 0) {
      glDeleteTextures(1,&ppVar2->second);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&__end2);
  }
  ksGpuWindow_Destroy(&this->window);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map(&this->m_colorToDepthMap);
  std::__cxx11::
  list<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>,_std::allocator<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>_>_>
  ::~list(&this->m_swapchainImageBuffers);
  IGraphicsPlugin::~IGraphicsPlugin(&this->super_IGraphicsPlugin);
  return;
}

Assistant:

~OpenGLGraphicsPlugin() override {
        if (m_swapchainFramebuffer != 0) {
            glDeleteFramebuffers(1, &m_swapchainFramebuffer);
        }
        if (m_program != 0) {
            glDeleteProgram(m_program);
        }
        if (m_vao != 0) {
            glDeleteVertexArrays(1, &m_vao);
        }
        if (m_cubeVertexBuffer != 0) {
            glDeleteBuffers(1, &m_cubeVertexBuffer);
        }
        if (m_cubeIndexBuffer != 0) {
            glDeleteBuffers(1, &m_cubeIndexBuffer);
        }

        for (auto& colorToDepth : m_colorToDepthMap) {
            if (colorToDepth.second != 0) {
                glDeleteTextures(1, &colorToDepth.second);
            }
        }

        ksGpuWindow_Destroy(&window);
    }